

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointAddDestinationTarget(HelicsEndpoint end,char *targetEndpoint,HelicsError *err)

{
  string_view newTarget;
  EndpointObject *pEVar1;
  EndpointObject *endObj;
  HelicsError *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  InterfaceType in_stack_ffffffffffffffcf;
  Interface *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     ((HelicsEndpoint)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0);
  if (pEVar1 != (EndpointObject *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    newTarget._M_str = (char *)pEVar1;
    newTarget._M_len = in_stack_ffffffffffffffd8;
    helics::Interface::addDestinationTarget
              (in_stack_ffffffffffffffd0,newTarget,in_stack_ffffffffffffffcf);
  }
  return;
}

Assistant:

void helicsEndpointAddDestinationTarget(HelicsEndpoint end, const char* targetEndpoint, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addDestinationTarget(targetEndpoint);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}